

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O0

void __thiscall adios2::query::RangeTree::AddLeaf(RangeTree *this,Op op,string *value)

{
  value_type *in_RDX;
  Range range;
  vector<adios2::query::Range,_std::allocator<adios2::query::Range>_> *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  Range::Range((Range *)0xd4678b);
  std::__cxx11::string::operator=(local_38,(string *)in_RDX);
  std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::push_back
            (in_stack_ffffffffffffffb0,in_RDX);
  Range::~Range((Range *)0xd467c3);
  return;
}

Assistant:

void AddLeaf(adios2::query::Op op, std::string value)
    {
        Range range;
        range.m_Op = op;
        range.m_StrValue = value;

        m_Leaves.push_back(range);
    }